

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmParseTree.cpp
# Opt level: O0

uint32 Wasm::WasmTypes::GetTypeByteSize(WasmType type)

{
  uint32 local_c;
  WasmType type_local;
  
  switch(type) {
  case Void:
    local_c = 8;
    break;
  case FirstLocalType:
    local_c = 4;
    break;
  case I64:
    local_c = 8;
    break;
  case F32:
    local_c = 4;
    break;
  case F64:
    local_c = 8;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    local_c = 0x10;
    break;
  default:
    Js::Throw::InternalError();
  case Ptr:
    local_c = 8;
  }
  return local_c;
}

Assistant:

uint32 GetTypeByteSize(WasmType type)
{
    switch (type)
    {
    case Void: return sizeof(Js::Var);
    case I32: return sizeof(int32);
    case I64: return sizeof(int64);
    case F32: return sizeof(float);
    case F64: return sizeof(double);
#ifdef ENABLE_WASM_SIMD
    case V128:
        Simd::EnsureSimdIsEnabled();
        CompileAssert(sizeof(Simd::simdvec) == 16);
        return sizeof(Simd::simdvec);
#endif
    case Ptr: return sizeof(void*);
    default:
        Js::Throw::InternalError();
    }
}